

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

double av1_convert_qindex_to_q(int qindex,aom_bit_depth_t bit_depth)

{
  int16_t iVar1;
  int in_ESI;
  aom_bit_depth_t in_stack_ffffffffffffffe8;
  undefined8 local_8;
  
  if (in_ESI == 8) {
    iVar1 = av1_ac_quant_QTX(8,8,in_stack_ffffffffffffffe8);
    local_8 = (double)(int)iVar1 / 4.0;
  }
  else if (in_ESI == 10) {
    iVar1 = av1_ac_quant_QTX(10,10,in_stack_ffffffffffffffe8);
    local_8 = (double)(int)iVar1 / 16.0;
  }
  else if (in_ESI == 0xc) {
    iVar1 = av1_ac_quant_QTX(0xc,0xc,in_stack_ffffffffffffffe8);
    local_8 = (double)(int)iVar1 / 64.0;
  }
  else {
    local_8 = -1.0;
  }
  return local_8;
}

Assistant:

double av1_convert_qindex_to_q(int qindex, aom_bit_depth_t bit_depth) {
  // Convert the index to a real Q value (scaled down to match old Q values)
  switch (bit_depth) {
    case AOM_BITS_8: return av1_ac_quant_QTX(qindex, 0, bit_depth) / 4.0;
    case AOM_BITS_10: return av1_ac_quant_QTX(qindex, 0, bit_depth) / 16.0;
    case AOM_BITS_12: return av1_ac_quant_QTX(qindex, 0, bit_depth) / 64.0;
    default:
      assert(0 && "bit_depth should be AOM_BITS_8, AOM_BITS_10 or AOM_BITS_12");
      return -1.0;
  }
}